

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall
Assimp::ASEImporter::InternReadFile
          (ASEImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  bool bVar2;
  IOStream *__p;
  pointer pIVar3;
  DeadlyImportError *this_00;
  reference pvVar4;
  long lVar5;
  size_type sVar6;
  reference pMVar7;
  Logger *this_01;
  reference ppaVar8;
  size_type sVar9;
  size_type sVar10;
  size_type sVar11;
  vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_> *this_02;
  vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_> *this_03;
  vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_> *this_04;
  vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_> *this_05;
  BaseNode *local_368;
  undefined1 local_2e8 [8];
  SkeletonMeshBuilder skeleton;
  Dummy *dummy;
  iterator __end1_3;
  iterator __begin1_3;
  vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_> *__range1_3;
  reference local_268;
  Mesh *mesh;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_> *__range1_2;
  reference local_240;
  Camera *camera;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_> *__range1_1;
  reference local_218;
  Light *light;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_> *__range1;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> nodes;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_1d8;
  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_1d0;
  const_iterator i_1;
  aiMesh **pp;
  __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
  local_1b8;
  iterator i;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  undefined1 local_190 [7];
  bool tookNormals;
  Parser parser;
  size_type s;
  undefined1 local_c8 [4];
  uint defaultFormat;
  vector<char,_std::allocator<char>_> mBuffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  ASEImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar3 != (pointer)0x0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_c8);
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                       (&local_30);
    BaseImporter::TextFileToBuffer
              (pIVar3,(vector<char,_std::allocator<char>_> *)local_c8,FORBID_EMPTY);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_c8,0);
    this->mBuffer = pvVar4;
    this->pcScene = pScene;
    lVar5 = std::__cxx11::string::length();
    parser._176_8_ = lVar5 + -1;
    lVar5 = std::__cxx11::string::c_str();
    if ((*(byte *)(lVar5 + parser._176_8_) | 0x20) == 99) {
      s._4_4_ = 0x6e;
    }
    else {
      s._4_4_ = 200;
    }
    ASE::Parser::Parser((Parser *)local_190,this->mBuffer,s._4_4_);
    this->mParser = (Parser *)local_190;
    ASE::Parser::Parse(this->mParser);
    bVar1 = std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::empty
                      (&this->mParser->m_vMeshes);
    if (!bVar1) {
      GenerateDefaultMaterial(this);
      bVar1 = false;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i);
      sVar6 = std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::size
                        (&this->mParser->m_vMeshes);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i,sVar6 * 2);
      local_1b8._M_current =
           (Mesh *)std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::begin
                             (&this->mParser->m_vMeshes);
      while( true ) {
        pp = (aiMesh **)
             std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::end
                       (&this->mParser->m_vMeshes);
        bVar2 = __gnu_cxx::operator!=
                          (&local_1b8,
                           (__normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                            *)&pp);
        if (!bVar2) break;
        pMVar7 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                 ::operator*(&local_1b8);
        if ((pMVar7->bSkip & 1U) == 0) {
          pMVar7 = __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                   ::operator*(&local_1b8);
          BuildUniqueRepresentation(this,pMVar7);
          pMVar7 = __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                   ::operator*(&local_1b8);
          bVar2 = GenerateNormals(this,pMVar7);
          if (bVar2) {
            bVar1 = true;
          }
          pMVar7 = __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                   ::operator*(&local_1b8);
          ConvertMeshes(this,pMVar7,(vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i);
        }
        __gnu_cxx::
        __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
        ::operator++(&local_1b8);
      }
      if (bVar1) {
        this_01 = DefaultLogger::get();
        Logger::debug(this_01,
                      "ASE: Taking normals from the file. Use the AI_CONFIG_IMPORT_ASE_RECONSTRUCT_NORMALS setting if you experience problems"
                     );
      }
      sVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i);
      pScene->mNumMeshes = (uint)sVar6;
      i_1._M_current = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
      pScene->mMeshes = i_1._M_current;
      local_1d8._M_current =
           (aiMesh **)
           std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                     ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i);
      __gnu_cxx::__normal_iterator<aiMesh*const*,std::vector<aiMesh*,std::allocator<aiMesh*>>>::
      __normal_iterator<aiMesh**>
                ((__normal_iterator<aiMesh*const*,std::vector<aiMesh*,std::allocator<aiMesh*>>> *)
                 &local_1d0,&local_1d8);
      while( true ) {
        nodes.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i);
        bVar1 = __gnu_cxx::operator!=
                          (&local_1d0,
                           (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                            *)&nodes.
                               super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) break;
        ppaVar8 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*(&local_1d0);
        if ((*ppaVar8)->mNumFaces != 0) {
          ppaVar8 = __gnu_cxx::
                    __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                    ::operator*(&local_1d0);
          *i_1._M_current = *ppaVar8;
          i_1._M_current = i_1._M_current + 1;
        }
        __gnu_cxx::
        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
        operator++(&local_1d0);
      }
      pScene->mNumMeshes = (uint)((ulong)((long)i_1._M_current - (long)pScene->mMeshes) >> 3);
      BuildMaterialIndices(this);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&i);
    }
    std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::vector
              ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
               &__range1);
    sVar6 = std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::size
                      (&this->mParser->m_vMeshes);
    sVar9 = std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::size
                      (&this->mParser->m_vLights);
    sVar10 = std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::size
                       (&this->mParser->m_vCameras);
    sVar11 = std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::size
                       (&this->mParser->m_vDummies);
    std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::reserve
              ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
               &__range1,sVar6 + sVar9 + sVar10 + sVar11);
    this_02 = &this->mParser->m_vLights;
    __end1 = std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::begin(this_02);
    light = (Light *)std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::end
                               (this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Assimp::ASE::Light_*,_std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>_>
                                       *)&light), bVar1) {
      __range1_1 = (vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_> *)
                   __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Light_*,_std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>_>
                   ::operator*(&__end1);
      local_218 = (reference)__range1_1;
      std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::push_back
                ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
                 &__range1,(value_type *)&__range1_1);
      __gnu_cxx::
      __normal_iterator<Assimp::ASE::Light_*,_std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>_>
      ::operator++(&__end1);
    }
    this_03 = &this->mParser->m_vCameras;
    __end1_1 = std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::begin
                         (this_03);
    camera = (Camera *)
             std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::end(this_03);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<Assimp::ASE::Camera_*,_std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>_>
                               *)&camera), bVar1) {
      __range1_2 = (vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_> *)
                   __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Camera_*,_std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>_>
                   ::operator*(&__end1_1);
      local_240 = (reference)__range1_2;
      std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::push_back
                ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
                 &__range1,(value_type *)&__range1_2);
      __gnu_cxx::
      __normal_iterator<Assimp::ASE::Camera_*,_std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>_>
      ::operator++(&__end1_1);
    }
    this_04 = &this->mParser->m_vMeshes;
    __end1_2 = std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::begin(this_04);
    mesh = (Mesh *)std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::end(this_04);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                               *)&mesh), bVar1) {
      local_268 = __gnu_cxx::
                  __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                  ::operator*(&__end1_2);
      local_368 = (BaseNode *)0x0;
      if (local_268 != (reference)0x0) {
        local_368 = &local_268->super_BaseNode;
      }
      __range1_3 = (vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_> *)local_368;
      std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::push_back
                ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
                 &__range1,(value_type *)&__range1_3);
      __gnu_cxx::
      __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
      ::operator++(&__end1_2);
    }
    this_05 = &this->mParser->m_vDummies;
    __end1_3 = std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::begin(this_05);
    dummy = (Dummy *)std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::end
                               (this_05);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<Assimp::ASE::Dummy_*,_std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>_>
                               *)&dummy), bVar1) {
      skeleton._72_8_ =
           __gnu_cxx::
           __normal_iterator<Assimp::ASE::Dummy_*,_std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>_>
           ::operator*(&__end1_3);
      std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::push_back
                ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
                 &__range1,(value_type *)&skeleton.mKnobsOnly);
      __gnu_cxx::
      __normal_iterator<Assimp::ASE::Dummy_*,_std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>_>
      ::operator++(&__end1_3);
    }
    BuildNodes(this,(vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
                    &__range1);
    BuildAnimations(this,(vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                          *)&__range1);
    BuildCameras(this);
    BuildLights(this);
    if ((pScene->mNumMeshes == 0) &&
       (pScene->mFlags = pScene->mFlags | 1, (this->noSkeletonMesh & 1U) == 0)) {
      SkeletonMeshBuilder::SkeletonMeshBuilder
                ((SkeletonMeshBuilder *)local_2e8,pScene,(aiNode *)0x0,false);
      SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_2e8);
    }
    std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::~vector
              ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *)
               &__range1);
    ASE::Parser::~Parser((Parser *)local_190);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_c8);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_30);
    return;
  }
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a8,"Failed to open ASE file ",pFile);
  std::operator+(&local_88,&local_a8,".");
  DeadlyImportError::DeadlyImportError(this_00,&local_88);
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ASEImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open ASE file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    this->mBuffer = &mBuffer2[0];
    this->pcScene = pScene;

    // ------------------------------------------------------------------
    // Guess the file format by looking at the extension
    // ASC is considered to be the older format 110,
    // ASE is the actual version 200 (that is currently written by max)
    // ------------------------------------------------------------------
    unsigned int defaultFormat;
    std::string::size_type s = pFile.length()-1;
    switch (pFile.c_str()[s])   {

    case 'C':
    case 'c':
        defaultFormat = AI_ASE_OLD_FILE_FORMAT;
        break;
    default:
        defaultFormat = AI_ASE_NEW_FILE_FORMAT;
    };

    // Construct an ASE parser and parse the file
    ASE::Parser parser(mBuffer,defaultFormat);
    mParser = &parser;
    mParser->Parse();

    //------------------------------------------------------------------
    // Check whether we god at least one mesh. If we did - generate
    // materials and copy meshes.
    // ------------------------------------------------------------------
    if ( !mParser->m_vMeshes.empty())   {

        // If absolutely no material has been loaded from the file
        // we need to generate a default material
        GenerateDefaultMaterial();

        // process all meshes
        bool tookNormals = false;
        std::vector<aiMesh*> avOutMeshes;
        avOutMeshes.reserve(mParser->m_vMeshes.size()*2);
        for (std::vector<ASE::Mesh>::iterator i =  mParser->m_vMeshes.begin();i != mParser->m_vMeshes.end();++i)    {
            if ((*i).bSkip) {
                continue;
            }
            BuildUniqueRepresentation(*i);

            // Need to generate proper vertex normals if necessary
            if(GenerateNormals(*i)) {
                tookNormals = true;
            }

            // Convert all meshes to aiMesh objects
            ConvertMeshes(*i,avOutMeshes);
        }
        if (tookNormals)    {
            ASSIMP_LOG_DEBUG("ASE: Taking normals from the file. Use "
                "the AI_CONFIG_IMPORT_ASE_RECONSTRUCT_NORMALS setting if you "
                "experience problems");
        }

        // Now build the output mesh list. Remove dummies
        pScene->mNumMeshes = (unsigned int)avOutMeshes.size();
        aiMesh** pp = pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        for (std::vector<aiMesh*>::const_iterator i =  avOutMeshes.begin();i != avOutMeshes.end();++i) {
            if (!(*i)->mNumFaces) {
                continue;
            }
            *pp++ = *i;
        }
        pScene->mNumMeshes = (unsigned int)(pp - pScene->mMeshes);

        // Build final material indices (remove submaterials and setup
        // the final list)
        BuildMaterialIndices();
    }

    // ------------------------------------------------------------------
    // Copy all scene graph nodes - lights, cameras, dummies and meshes
    // into one huge list.
    //------------------------------------------------------------------
    std::vector<BaseNode*> nodes;
    nodes.reserve(mParser->m_vMeshes.size() +mParser->m_vLights.size()
        + mParser->m_vCameras.size() + mParser->m_vDummies.size());

    // Lights
    for (auto &light : mParser->m_vLights)nodes.push_back(&light);
    // Cameras
    for (auto &camera : mParser->m_vCameras)nodes.push_back(&camera);
    // Meshes
    for (auto &mesh : mParser->m_vMeshes)nodes.push_back(&mesh);
    // Dummies
    for (auto &dummy : mParser->m_vDummies)nodes.push_back(&dummy);

    // build the final node graph
    BuildNodes(nodes);

    // build output animations
    BuildAnimations(nodes);

    // build output cameras
    BuildCameras();

    // build output lights
    BuildLights();

    // ------------------------------------------------------------------
    // If we have no meshes use the SkeletonMeshBuilder helper class
    // to build a mesh for the animation skeleton
    // FIXME: very strange results
    // ------------------------------------------------------------------
    if (!pScene->mNumMeshes)    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        if (!noSkeletonMesh) {
            SkeletonMeshBuilder skeleton(pScene);
        }
    }
}